

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

void __thiscall Fl_Browser::insert(Fl_Browser *this,int line,FL_BLINE *item)

{
  FL_BLINE *pFVar1;
  int iVar2;
  FL_BLINE *a;
  
  a = (FL_BLINE *)&this->first;
  if (this->first == (FL_BLINE *)0x0) {
    item->prev = (FL_BLINE *)0x0;
    item->next = (FL_BLINE *)0x0;
    this->last = item;
  }
  else if (line < 2) {
    Fl_Browser_::inserting(&this->super_Fl_Browser_,this->first,item);
    item->prev = (FL_BLINE *)0x0;
    pFVar1 = this->first;
    item->next = pFVar1;
    pFVar1->prev = item;
  }
  else if (this->lines < line) {
    a = (FL_BLINE *)&this->last;
    pFVar1 = this->last;
    item->prev = pFVar1;
    pFVar1->next = item;
    item->next = (FL_BLINE *)0x0;
  }
  else {
    a = find_line(this,line);
    Fl_Browser_::inserting(&this->super_Fl_Browser_,a,item);
    item->next = a;
    pFVar1 = a->prev;
    item->prev = pFVar1;
    pFVar1->next = item;
  }
  a->prev = item;
  this->cacheline = line;
  this->cache = item;
  this->lines = this->lines + 1;
  iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                    (this,item);
  this->full_height_ = this->full_height_ + iVar2;
  Fl_Browser_::redraw_line(&this->super_Fl_Browser_,item);
  return;
}

Assistant:

void Fl_Browser::insert(int line, FL_BLINE* item) {
  if (!first) {
    item->prev = item->next = 0;
    first = last = item;
  } else if (line <= 1) {
    inserting(first, item);
    item->prev = 0;
    item->next = first;
    item->next->prev = item;
    first = item;
  } else if (line > lines) {
    item->prev = last;
    item->prev->next = item;
    item->next = 0;
    last = item;
  } else {
    FL_BLINE* n = find_line(line);
    inserting(n, item);
    item->next = n;
    item->prev = n->prev;
    item->prev->next = item;
    n->prev = item;
  }
  cacheline = line;
  cache = item;
  lines++;
  full_height_ += item_height(item);
  redraw_line(item);
}